

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O0

PatternView * __thiscall ZXing::PatternView::subView(PatternView *this,int offset,int size)

{
  Iterator puVar1;
  int *piVar2;
  int in_ECX;
  int in_EDX;
  PatternView *in_RSI;
  PatternView *in_RDI;
  int local_14;
  int local_10;
  int local_c;
  
  if (in_ECX == 0) {
    local_10 = in_RSI->_size - in_EDX;
  }
  else {
    local_10 = in_ECX;
    if (in_ECX < 0) {
      local_10 = (in_RSI->_size - in_EDX) + in_ECX;
    }
  }
  local_c = in_EDX;
  puVar1 = begin(in_RSI);
  local_14 = 0;
  piVar2 = std::max<int>(&local_10,&local_14);
  PatternView(in_RDI,puVar1 + local_c,*piVar2,in_RSI->_base,in_RSI->_end);
  return in_RDI;
}

Assistant:

PatternView subView(int offset, int size = 0) const
	{
//		if(std::abs(size) > count())
//			printf("%d > %d\n", std::abs(size), _count);
//		assert(std::abs(size) <= count());
		if (size == 0)
			size = _size - offset;
		else if (size < 0)
			size = _size - offset + size;
		return {begin() + offset, std::max(size, 0), _base, _end};
	}